

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emplace.cc
# Opt level: O1

void _test<phmap::flat_hash_map<int,custom_type_2,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,custom_type_2>>>,int,custom_type_2,void,_emplace>
               (size_t iterations,size_t container_size,char *map_name)

{
  char *pcVar1;
  long lVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  _emplace<phmap::flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>,_int,_custom_type_2,_void>
  insert;
  flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
  m;
  _emplace<phmap::flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>,_int,_custom_type_2,_void>
  local_79;
  long local_78;
  size_t local_70;
  char *local_68;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
  local_60;
  
  local_68 = map_name;
  local_78 = std::chrono::_V2::system_clock::now();
  local_70 = iterations;
  if (iterations == 0) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    sVar6 = 0;
    do {
      local_60.ctrl_ =
           phmap::priv::
           EmptyGroup<std::is_same<std::allocator<std::pair<int_const,custom_type_2>>,std::allocator<std::pair<int_const,custom_type_2>>>>()
           ::empty_group;
      local_60.settings_.
      super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
      .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
            )(_Head_base<0UL,_unsigned_long,_false>)0x0;
      local_60.capacity_ = 0;
      local_60.slots_ = (slot_type *)0x0;
      local_60.size_ = 0;
      if (container_size != 0) {
        sVar7 = 0;
        do {
          _emplace<phmap::flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>,_int,_custom_type_2,_void>
          ::operator()(&local_79,
                       (flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
                        *)&local_60,sVar7);
          sVar7 = sVar7 + 1;
        } while (container_size != sVar7);
      }
      sVar7 = local_60.size_;
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
      ::destroy_slots(&local_60);
      lVar5 = lVar5 + sVar7;
      sVar6 = sVar6 + 1;
    } while (sVar6 != local_70);
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  if (lVar5 != container_size * local_70) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"  invalid count: ",0x11);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  pcVar1 = local_68;
  if (local_68 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::clog + -0x18) + 0x10d028);
  }
  else {
    sVar4 = strlen(local_68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,pcVar1,sVar4);
  }
  *(uint *)(__cxa_begin_catch + *(long *)(std::clog + -0x18)) =
       *(uint *)(__cxa_begin_catch + *(long *)(std::clog + -0x18)) & 0xfffffefb | 4;
  poVar3 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::clog,(int)((double)(lVar2 - local_78) / 1000000.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ms\n",4);
  return;
}

Assistant:

void _test(std::size_t iterations, std::size_t container_size, const char *map_name)
{
    std::size_t count = 0;
    auto t1 = std::chrono::high_resolution_clock::now();
    INSERT<Map, K, V, T> insert;
    for (std::size_t i=0; i<iterations; ++i)
    {
        Map m;
        for (std::size_t j=0; j<container_size; ++j)
            insert(m, j);
        count += m.size();
    }
    auto t2 = std::chrono::high_resolution_clock::now();
    auto elapsed = milliseconds<double>(t2 - t1).count();
    if (count != iterations*container_size)
        std::clog << "  invalid count: " << count << "\n";
    std::clog << map_name << std::fixed << int(elapsed) << " ms\n";
}